

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

KdTreeAggregate *
pbrt::KdTreeAggregate::Create
          (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *prims,
          ParameterDictionary *parameters)

{
  int iVar1;
  KdTreeAggregate *this;
  allocator<char> *in_RSI;
  undefined8 in_RDI;
  Float FVar2;
  int unaff_retaddr;
  int unaff_retaddr_00;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *in_stack_00000008;
  KdTreeAggregate *in_stack_00000010;
  int maxDepth;
  int maxPrims;
  Float emptyBonus;
  int travCost;
  int isectCost;
  string *in_stack_fffffffffffffe58;
  ParameterDictionary *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  allocator<char> *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  allocator<char> local_e9;
  string local_e8 [32];
  int local_c8;
  allocator<char> local_c1;
  string local_c0 [32];
  int local_a0;
  allocator<char> local_99;
  string local_98 [32];
  Float local_78;
  allocator<char> local_71;
  string local_70 [32];
  int local_50;
  allocator<char> local_39;
  string local_38 [36];
  int local_14;
  allocator<char> *paVar3;
  int maxDepth_00;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,in_stack_fffffffffffffe90);
  iVar1 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_14 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,in_stack_fffffffffffffe90);
  iVar1 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,0);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_50 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
             ,in_stack_fffffffffffffe90);
  FVar2 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,0.0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  __s = &local_c1;
  local_78 = FVar2;
  paVar3 = in_RSI;
  std::allocator<char>::allocator();
  maxDepth_00 = (int)((ulong)paVar3 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(FVar2,in_stack_fffffffffffffea0),(char *)__s,in_RSI);
  iVar1 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_a0 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(FVar2,in_stack_fffffffffffffea0),(char *)__s,in_RSI);
  iVar1 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_c8 = iVar1;
  this = (KdTreeAggregate *)operator_new(0x68);
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::vector
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)this,
             (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)this);
  KdTreeAggregate(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                  (Float)((ulong)in_RDI >> 0x20),(int)in_RDI,maxDepth_00);
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~vector
            ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffe70));
  return this;
}

Assistant:

KdTreeAggregate *KdTreeAggregate::Create(std::vector<PrimitiveHandle> prims,
                                         const ParameterDictionary &parameters) {
    int isectCost = parameters.GetOneInt("intersectcost", 80);
    int travCost = parameters.GetOneInt("traversalcost", 1);
    Float emptyBonus = parameters.GetOneFloat("emptybonus", 0.5f);
    int maxPrims = parameters.GetOneInt("maxprims", 1);
    int maxDepth = parameters.GetOneInt("maxdepth", -1);
    return new KdTreeAggregate(std::move(prims), isectCost, travCost, emptyBonus,
                               maxPrims, maxDepth);
}